

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionEvaluator.cxx
# Opt level: O1

void __thiscall
GeneratorExpressionContent::~GeneratorExpressionContent(GeneratorExpressionContent *this)

{
  pointer ppcVar1;
  pointer pvVar2;
  pointer ppcVar3;
  pointer pvVar4;
  
  (this->super_cmGeneratorExpressionEvaluator)._vptr_cmGeneratorExpressionEvaluator =
       (_func_int **)&PTR__GeneratorExpressionContent_00691638;
  ppcVar1 = (this->IdentifierChildren).
            super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppcVar3 = (this->IdentifierChildren).
                 super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppcVar3 != ppcVar1;
      ppcVar3 = ppcVar3 + 1) {
    if (*ppcVar3 != (cmGeneratorExpressionEvaluator *)0x0) {
      (*(*ppcVar3)->_vptr_cmGeneratorExpressionEvaluator[1])();
    }
  }
  pvVar2 = (this->ParamChildren).
           super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar4 = (this->ParamChildren).
                super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pvVar4 != pvVar2; pvVar4 = pvVar4 + 1) {
    ppcVar1 = (pvVar4->
              super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    for (ppcVar3 = (pvVar4->
                   super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                   )._M_impl.super__Vector_impl_data._M_start; ppcVar3 != ppcVar1;
        ppcVar3 = ppcVar3 + 1) {
      if (*ppcVar3 != (cmGeneratorExpressionEvaluator *)0x0) {
        (*(*ppcVar3)->_vptr_cmGeneratorExpressionEvaluator[1])();
      }
    }
  }
  std::
  vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
  ::~vector(&this->ParamChildren);
  ppcVar3 = (this->IdentifierChildren).
            super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppcVar3 != (pointer)0x0) {
    operator_delete(ppcVar3,(long)(this->IdentifierChildren).
                                  super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppcVar3
                   );
    return;
  }
  return;
}

Assistant:

GeneratorExpressionContent::~GeneratorExpressionContent()
{
  cmDeleteAll(this->IdentifierChildren);
  std::for_each(this->ParamChildren.begin(), this->ParamChildren.end(),
                cmDeleteAll<std::vector<cmGeneratorExpressionEvaluator*> >);
}